

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O3

bool __thiscall CMessageHeader::IsCommandValid(CMessageHeader *this)

{
  uchar uVar1;
  ulong uVar2;
  byte bVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  uVar2 = 4;
  do {
    uVar1 = (this->pchMessageStart)._M_elems[uVar2];
    if (uVar1 == '\0') goto LAB_00d58a88;
    bVar3 = uVar1 - 0x20;
    bVar4 = bVar3 < 0x5f;
  } while ((uVar2 < 0xf) && (uVar2 = uVar2 + 1, bVar3 < 0x5f));
  goto LAB_00d58a96;
  while (uVar2 = uVar2 + 1, uVar1 == '\0') {
LAB_00d58a88:
    uVar1 = (this->pchMessageStart)._M_elems[uVar2];
    bVar4 = uVar1 == '\0';
    if (uVar2 == 0xf) break;
  }
LAB_00d58a96:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CMessageHeader::IsCommandValid() const
{
    // Check the command string for errors
    for (const char* p1 = pchCommand; p1 < pchCommand + COMMAND_SIZE; ++p1) {
        if (*p1 == 0) {
            // Must be all zeros after the first zero
            for (; p1 < pchCommand + COMMAND_SIZE; ++p1) {
                if (*p1 != 0) {
                    return false;
                }
            }
        } else if (*p1 < ' ' || *p1 > 0x7E) {
            return false;
        }
    }

    return true;
}